

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O3

int Cnf_DataWriteOrClause2(void *p,Cnf_Dat_t *pCnf)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int *piVar4;
  int iVar5;
  lit *begin;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  pAVar1 = pCnf->pMan;
  lVar8 = (long)pAVar1->nObjs[3];
  begin = (lit *)malloc(lVar8 * 4);
  pVVar2 = pAVar1->vCos;
  uVar6 = (ulong)pVVar2->nSize;
  if (0 < (long)uVar6) {
    ppvVar3 = pVVar2->pArray;
    piVar4 = pCnf->pVarNums;
    uVar7 = 0;
    do {
      begin[uVar7] = piVar4[*(int *)((long)ppvVar3[uVar7] + 0x24)] * 2;
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar6);
  }
  iVar5 = sat_solver2_addclause((sat_solver2 *)p,begin,begin + lVar8,0);
  if (begin != (lit *)0x0) {
    free(begin);
  }
  return (int)(iVar5 != 0);
}

Assistant:

int Cnf_DataWriteOrClause2( void * p, Cnf_Dat_t * pCnf )
{
    sat_solver2 * pSat = (sat_solver2 *)p;
    Aig_Obj_t * pObj;
    int i, * pLits;
    pLits = ABC_ALLOC( int, Aig_ManCoNum(pCnf->pMan) );
    Aig_ManForEachCo( pCnf->pMan, pObj, i )
        pLits[i] = toLitCond( pCnf->pVarNums[pObj->Id], 0 );
    if ( !sat_solver2_addclause( pSat, pLits, pLits + Aig_ManCoNum(pCnf->pMan), 0 ) )
    {
        ABC_FREE( pLits );
        return 0;
    }
    ABC_FREE( pLits );
    return 1;
}